

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::GetRelationship(Prim *prim,string *rel_name,Relationship *out_rel,string *err)

{
  bool bVar1;
  ostream *poVar2;
  Relationship *pRVar3;
  string local_990 [39];
  allocator local_969;
  string local_968 [32];
  fmt local_948 [32];
  ostringstream local_928 [8];
  ostringstream ss_e_1;
  undefined1 local_7a8 [8];
  Property prop;
  ostringstream local_1a8 [8];
  ostringstream ss_e;
  string *err_local;
  Relationship *out_rel_local;
  string *rel_name_local;
  Prim *prim_local;
  
  if (out_rel == (Relationship *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetRelationship");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7fe);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a8,"`out_rel` argument is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&prop._has_custom);
      ::std::__cxx11::string::~string((string *)&prop._has_custom);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    Property::Property((Property *)local_7a8);
    bVar1 = GetProperty(prim,rel_name,(Property *)local_7a8,err);
    if (bVar1) {
      bVar1 = Property::is_relationship((Property *)local_7a8);
      if (bVar1) {
        pRVar3 = Property::get_relationship((Property *)local_7a8);
        Relationship::operator=(out_rel,pRVar3);
      }
      ::std::__cxx11::ostringstream::ostringstream(local_928);
      poVar2 = ::std::operator<<((ostream *)local_928,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"GetRelationship");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x80b);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_968,"{} is not a Relationship.",&local_969);
      fmt::format<std::__cxx11::string>
                (local_948,(string *)local_968,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rel_name);
      poVar2 = ::std::operator<<((ostream *)local_928,(string *)local_948);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_948);
      ::std::__cxx11::string::~string(local_968);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_969);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_990);
        ::std::__cxx11::string::~string(local_990);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_928);
    }
    Property::~Property((Property *)local_7a8);
  }
  return false;
}

Assistant:

bool GetRelationship(const tinyusdz::Prim &prim, const std::string &rel_name,
                     Relationship *out_rel, std::string *err) {
  if (!out_rel) {
    PUSH_ERROR_AND_RETURN("`out_rel` argument is nullptr.");
  }

  // First lookup as Property, then check if its Relationship
  Property prop;
  if (!GetProperty(prim, rel_name, &prop, err)) {
    return false;
  }

  if (prop.is_relationship()) {
    (*out_rel) = std::move(prop.get_relationship());
  }

  PUSH_ERROR_AND_RETURN(fmt::format("{} is not a Relationship.", rel_name));

  return true;
}